

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

void write_parser_tables_internal
               (Grammar *g,char *base_pathname,char *tag,int binary,FILE *fp,uint8 **str,
               uint *str_len)

{
  int iVar1;
  char local_1b8 [4];
  int header;
  char ver [128];
  FILE *local_130;
  FILE *actions_fp;
  File file;
  uint8 **str_local;
  FILE *fp_local;
  int binary_local;
  char *tag_local;
  char *base_pathname_local;
  Grammar *g_local;
  
  local_130 = (FILE *)0x0;
  file._232_8_ = str;
  str_local = (uint8 **)fp;
  if ((binary == 0) &&
     (str_local = (uint8 **)fopen(g->write_pathname,"w"), (FILE *)str_local == (FILE *)0x0)) {
    d_fail("unable to open `%s` for write\n",g->write_pathname);
  }
  if ((*g->actions_write_pathname != '\0') &&
     (local_130 = fopen(g->actions_write_pathname,"w"), local_130 == (FILE *)0x0)) {
    d_fail("unable to open `%s` for write\n",g->actions_write_pathname);
  }
  file_init((File *)&actions_fp,binary,(FILE *)str_local,(FILE *)local_130,(uint8 **)file._232_8_,
            str_len);
  if (binary == 0) {
    iVar1 = write_header(g,base_pathname,tag);
    d_version(local_1b8);
    myfprintf((FILE *)str_local,"/*\n  Generated by Make DParser Version %s\n",local_1b8);
    myfprintf((FILE *)str_local,"  Available at https://github.com/jplevyak/dparser\n*/\n\n");
    g->write_line = 7;
    write_global_code((File *)&actions_fp,g,tag);
    myfprintf((FILE *)str_local,"#include \"stdlib.h\"\n");
    myfprintf((FILE *)str_local,"#include \"dparse.h\"\n");
    g->write_line = g->write_line + 1;
    if (iVar1 != 0) {
      myfprintf((FILE *)str_local,"#include \"%s.d_parser.h\"\n",base_pathname);
      g->write_line = g->write_line + 1;
    }
    myfprintf((FILE *)str_local,"\n");
    g->write_line = g->write_line + 1;
  }
  write_parser_tables(g,tag,(File *)&actions_fp);
  return;
}

Assistant:

void write_parser_tables_internal(Grammar *g, char *base_pathname, char *tag, int binary, FILE *fp, uint8 **str,
                                  uint *str_len) {
  File file;
  FILE *actions_fp = NULL;
  if (!binary) {
    fp = fopen(g->write_pathname, "w");
    if (!fp) d_fail("unable to open `%s` for write\n", g->write_pathname);
  }
  if (g->actions_write_pathname[0]) {
    actions_fp = fopen(g->actions_write_pathname, "w");
    if (!actions_fp) d_fail("unable to open `%s` for write\n", g->actions_write_pathname);
  }
  file_init(&file, binary, fp, actions_fp, str, str_len);
  if (!binary) {
    char ver[128];
    int header = write_header(g, base_pathname, tag);
    d_version(ver);
    fprintf(fp, "/*\n  Generated by Make DParser Version %s\n", ver);
    fprintf(fp, "  Available at https://github.com/jplevyak/dparser\n*/\n\n");
    g->write_line = 7;
    write_global_code(&file, g, tag);
    fprintf(fp, "#include \"stdlib.h\"\n");
    fprintf(fp, "#include \"dparse.h\"\n");
    g->write_line++;

    if (header) {
      fprintf(fp, "#include \"%s.d_parser.h\"\n", base_pathname);
      g->write_line++;
    }
    fprintf(fp, "\n");
    g->write_line++;
  }
  write_parser_tables(g, tag, &file);
}